

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void cs::foreach_helper<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>,cs_impl::any>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  bool bVar1;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *this;
  element_type *peVar2;
  exception *e;
  exception *e_1;
  statement_base **ptr;
  iterator __end3;
  iterator __begin3;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range3;
  any *it;
  const_iterator __end0;
  const_iterator __begin0;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *__range2;
  scope_guard scope;
  _Self *in_stack_fffffffffffffe98;
  process_context *in_stack_fffffffffffffea0;
  any *in_stack_ffffffffffffff20;
  var *in_stack_ffffffffffffff80;
  any *in_stack_ffffffffffffff88;
  domain_manager *in_stack_ffffffffffffff90;
  _Self local_50;
  _Self local_48 [3];
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *local_30;
  
  this = cs_impl::any::const_val<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>>
                   (in_stack_ffffffffffffff20);
  bVar1 = std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::empty(this);
  if (!bVar1) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x5d9d94);
    peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x5d9da0);
    if ((peVar2->break_block & 1U) != 0) {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x5d9db6);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5d9dc2);
      peVar2->break_block = false;
    }
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x5d9dd6);
    peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x5d9de2);
    if ((peVar2->continue_block & 1U) != 0) {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x5d9df8);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5d9e04);
      peVar2->continue_block = false;
    }
    scope_guard::scope_guard
              ((scope_guard *)in_stack_fffffffffffffea0,(context_t *)in_stack_fffffffffffffe98);
    local_30 = cs_impl::any::
               const_val<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>>
                         (in_stack_ffffffffffffff20);
    local_48[0]._M_node =
         (_List_node_base *)
         std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::begin
                   ((list<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffe98);
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::end
                   ((list<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffe98);
    while (bVar1 = std::operator!=(local_48,&local_50), bVar1) {
      std::_List_const_iterator<cs_impl::any>::operator*
                ((_List_const_iterator<cs_impl::any> *)in_stack_fffffffffffffea0);
      process_context::poll_event(in_stack_fffffffffffffea0);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x5d9ebc);
      std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x5d9ec8);
      domain_manager::add_var_no_return<std::__cxx11::string_const&>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                 in_stack_fffffffffffffe98);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                 in_stack_fffffffffffffe98);
      while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98),
            bVar1) {
        std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
        operator*((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                   *)&stack0xffffffffffffff80);
        statement_base::run((statement_base *)in_stack_fffffffffffffea0);
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x5da1f6);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5da202);
        if ((peVar2->return_fcall & 1U) != 0) goto LAB_005da2ea;
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x5da225);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5da231);
        if ((peVar2->break_block & 1U) != 0) {
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x5da247);
          peVar2 = std::
                   __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x5da253);
          peVar2->break_block = false;
          goto LAB_005da2ea;
        }
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x5da274);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5da280);
        if ((peVar2->continue_block & 1U) != 0) {
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x5da296);
          peVar2 = std::
                   __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x5da2a2);
          peVar2->continue_block = false;
          break;
        }
        std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
        operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                    *)in_stack_fffffffffffffea0);
      }
      scope_guard::clear((scope_guard *)0x5da2cc);
      std::_List_const_iterator<cs_impl::any>::operator++(local_48);
    }
LAB_005da2ea:
    scope_guard::~scope_guard((scope_guard *)0x5da2f7);
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}